

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void qt_alphamapblit_argb32_oneline
               (uchar *map,int mapWidth,QRgba64 *srcColor,quint32 *dest,quint32 c,
               QColorTrcLut *colorProfile)

{
  byte bVar1;
  _Head_base<0UL,_unsigned_short_*,_false> _Var2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [12];
  undefined1 auVar14 [14];
  undefined1 auVar15 [12];
  undefined1 auVar16 [14];
  undefined1 auVar17 [12];
  undefined1 auVar18 [14];
  undefined1 auVar19 [12];
  undefined1 auVar20 [14];
  unkbyte10 Var21;
  ushort uVar22;
  QRgb QVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  QRgba64 rgb64;
  ulong uVar31;
  undefined2 uVar32;
  undefined1 uVar37;
  byte bVar38;
  byte bVar39;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  short sVar42;
  short sVar48;
  short sVar49;
  short sVar50;
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  short sVar51;
  short sVar56;
  short sVar57;
  short sVar58;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ushort uVar62;
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 uVar36;
  undefined1 auVar44 [16];
  undefined1 auVar55 [16];
  undefined1 auVar60 [16];
  
  if (0 < mapWidth) {
    uVar27 = ((ulong)c << 0x18 | (ulong)c) & 0xff00ff00ff00ff;
    uVar25 = (ulong)(~c >> 0x18);
    uVar31 = 0;
    do {
      bVar1 = map[uVar31];
      if (bVar1 == 0) goto LAB_0067facc;
      QVar23 = c;
      if ((colorProfile == (QColorTrcLut *)0x0) || (bVar1 == 0xff)) {
        if (bVar1 == 0xff) {
          if (c < 0xff000000) {
            if (c == 0) goto LAB_0067facc;
            uVar30 = (((ulong)dest[uVar31] << 0x18 | (ulong)dest[uVar31]) & 0xff00ff00ff00ff) *
                     uVar25;
            uVar30 = uVar30 + 0x80008000800080 + (uVar30 >> 8 & 0xff00ff00ff00ff) >> 8 &
                     0xff00ff00ff00ff;
            uVar24 = (uint)(uVar30 >> 0x18) | (uint)uVar30;
LAB_0067fac6:
            QVar23 = uVar24 + c;
          }
        }
        else {
          if (c == 0) goto LAB_0067facc;
          uVar30 = uVar27 * bVar1;
          uVar26 = uVar30 + 0x80008000800080 + (uVar30 >> 8 & 0xff00ff00ff00ff);
          uVar30 = uVar26 >> 8 & 0xff00ff00ff00ff;
          uVar26 = (((ulong)dest[uVar31] << 0x18 | (ulong)dest[uVar31]) & 0xff00ff00ff00ff) *
                   (~uVar26 >> 0x38);
          uVar26 = uVar26 + 0x80008000800080 + (uVar26 >> 8 & 0xff00ff00ff00ff) >> 8 &
                   0xff00ff00ff00ff;
          QVar23 = ((uint)(uVar26 >> 0x18) | (uint)uVar26) + ((uint)(uVar30 >> 0x18) | (uint)uVar30)
          ;
        }
LAB_0067fac8:
        dest[uVar31] = QVar23;
      }
      else {
        uVar24 = dest[uVar31];
        uVar30 = (ulong)uVar24;
        if (0xfe < uVar24 >> 0x18) {
          uVar36 = (undefined1)(uVar24 >> 8);
          uVar37 = (undefined1)(uVar24 >> 0x10);
          bVar38 = (byte)(uVar24 >> 0x18);
          uVar32 = (undefined2)uVar24;
          if (c < 0xff000000) {
            uVar28 = uVar24;
            if (c != 0) {
              uVar30 = ((uVar30 << 0x18 | uVar30) & 0xff00ff00ff00ff) * uVar25;
              uVar30 = uVar30 + 0x80008000800080 + (uVar30 >> 8 & 0xff00ff00ff00ff) >> 8 &
                       0xff00ff00ff00ff;
              uVar28 = ((uint)(uVar30 >> 0x18) | (uint)uVar30) + c;
            }
            _Var2._M_head_impl =
                 (colorProfile->m_toLinear)._M_t.
                 super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
                 super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
            if (_Var2._M_head_impl == (unsigned_short *)0x0) {
              qt_alphamapblit_argb32_oneline();
              goto LAB_0067faec;
            }
            bVar39 = (byte)(uVar28 >> 0x18);
            auVar33 = psllw(ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7
                                                  )bVar39 << 0x30) >> 0x28),
                                                  CONCAT14((char)(uVar28 >> 0x10),uVar28)) >> 0x20),
                                                  uVar28) >> 0x18),(char)(uVar28 >> 8)),
                                             (ushort)(byte)uVar28) & 0xffffff00ffffff),4);
            uVar62 = SUB162(ZEXT116(bVar39) << 0x38,6);
            auVar45._8_8_ = 0;
            auVar45._0_8_ =
                 (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)
                                                  bVar38 << 0x30) >> 0x28),CONCAT14(uVar37,uVar24))
                                                  >> 0x20),uVar24) >> 0x18),CONCAT12(uVar36,uVar32))
                                       >> 0x10),uVar32) & 0xffff00ff00ff00ff;
            auVar52 = psllw(auVar45,4);
            uVar22 = SUB162(ZEXT116(bVar38) << 0x38,6);
            sVar42 = (_Var2._M_head_impl[auVar33._4_2_] >> 8) + _Var2._M_head_impl[auVar33._4_2_];
            sVar48 = (_Var2._M_head_impl[auVar33._2_2_] >> 8) + _Var2._M_head_impl[auVar33._2_2_];
            auVar53._2_2_ = sVar48;
            auVar53._0_2_ = sVar42;
            sVar49 = (_Var2._M_head_impl[auVar33._0_2_] >> 8) + _Var2._M_head_impl[auVar33._0_2_];
            auVar53._4_2_ = sVar49;
            sVar50 = (uVar62 >> 8) + uVar62;
            auVar53._6_2_ = sVar50;
            sVar51 = (_Var2._M_head_impl[auVar52._4_2_] >> 8) + _Var2._M_head_impl[auVar52._4_2_];
            sVar56 = (_Var2._M_head_impl[auVar52._2_2_] >> 8) + _Var2._M_head_impl[auVar52._2_2_];
            auVar46._2_2_ = sVar56;
            auVar46._0_2_ = sVar51;
            sVar57 = (_Var2._M_head_impl[auVar52._0_2_] >> 8) + _Var2._M_head_impl[auVar52._0_2_];
            auVar46._4_2_ = sVar57;
            sVar58 = (uVar22 >> 8) + uVar22;
            auVar46._6_2_ = sVar58;
            uVar24 = bVar1 ^ 0xff;
            auVar53._8_8_ = 0;
            auVar46._8_8_ = 0;
            auVar61 = pshuflw(ZEXT216(CONCAT11(bVar1,bVar1)),ZEXT216(CONCAT11(bVar1,bVar1)),0);
            uVar62 = sVar50 * auVar61._6_2_;
            auVar33._0_10_ = (unkuint10)uVar62 << 0x30;
            auVar52._0_12_ = ZEXT212(uVar62) << 0x30;
            auVar53 = pmulhuw(auVar53,auVar61);
            auVar52._12_2_ = uVar62;
            auVar52._14_2_ = auVar53._6_2_;
            auVar33._12_4_ = auVar52._12_4_;
            auVar33._10_2_ = auVar53._4_2_;
            Var21 = CONCAT64(auVar33._10_6_,CONCAT22(sVar49 * auVar61._4_2_,uVar62));
            auVar17._4_8_ = (long)((unkuint10)Var21 >> 0x10);
            auVar17._2_2_ = auVar53._2_2_;
            auVar17._0_2_ = sVar48 * auVar61._2_2_;
            auVar7._10_2_ = 0;
            auVar7._0_10_ = auVar53._0_10_;
            auVar7._12_2_ = auVar53._6_2_;
            auVar10._8_2_ = auVar53._4_2_;
            auVar10._0_8_ = auVar53._0_8_;
            auVar10._10_4_ = auVar7._10_4_;
            auVar18._6_8_ = 0;
            auVar18._0_6_ = auVar10._8_6_;
            auVar61._0_4_ =
                 (int)((uint)auVar53._0_2_ + CONCAT22(auVar53._0_2_,sVar42 * auVar61._0_2_) + 0x8000
                      ) >> 0x10;
            auVar61._4_4_ =
                 (int)CONCAT82(SUB148(auVar18 << 0x40,6),auVar53._2_2_) + auVar17._0_4_ + 0x8000 >>
                 0x10;
            auVar61._8_4_ = auVar10._8_4_ + (int)((unkuint10)Var21 >> 0x10) + 0x8000 >> 0x10;
            auVar61._12_4_ = (int)((auVar7._10_4_ >> 0x10) + auVar33._12_4_ + 0x8000) >> 0x10;
            auVar52 = packssdw(auVar61,auVar61);
            auVar33 = ZEXT416(uVar24 << 8 | uVar24);
            auVar33 = pshuflw(auVar33,auVar33,0);
            uVar62 = sVar58 * auVar33._6_2_;
            auVar54._0_10_ = (unkuint10)uVar62 << 0x30;
            auVar55._0_12_ = ZEXT212(uVar62) << 0x30;
            auVar53 = pmulhuw(auVar46,auVar33);
            auVar55._12_2_ = uVar62;
            auVar55._14_2_ = auVar53._6_2_;
            auVar54._12_4_ = auVar55._12_4_;
            auVar54._10_2_ = auVar53._4_2_;
            Var21 = CONCAT64(auVar54._10_6_,CONCAT22(sVar57 * auVar33._4_2_,uVar62));
            auVar19._4_8_ = (long)((unkuint10)Var21 >> 0x10);
            auVar19._2_2_ = auVar53._2_2_;
            auVar19._0_2_ = sVar56 * auVar33._2_2_;
            auVar4._10_2_ = 0;
            auVar4._0_10_ = auVar53._0_10_;
            auVar4._12_2_ = auVar53._6_2_;
            auVar8._8_2_ = auVar53._4_2_;
            auVar8._0_8_ = auVar53._0_8_;
            auVar8._10_4_ = auVar4._10_4_;
            auVar20._6_8_ = 0;
            auVar20._0_6_ = auVar8._8_6_;
            auVar12._4_2_ = auVar53._2_2_;
            auVar12._0_4_ = auVar53._0_4_;
            auVar12._6_8_ = SUB148(auVar20 << 0x40,6);
            auVar47._0_4_ =
                 (int)((auVar53._0_4_ & 0xffff) + CONCAT22(auVar53._0_2_,sVar51 * auVar33._0_2_) +
                      0x8000) >> 0x10;
            auVar47._4_4_ = auVar12._4_4_ + auVar19._0_4_ + 0x8000 >> 0x10;
            auVar47._8_4_ = auVar8._8_4_ + (int)((unkuint10)Var21 >> 0x10) + 0x8000 >> 0x10;
            auVar47._12_4_ = (int)((auVar4._10_4_ >> 0x10) + auVar54._12_4_ + 0x8000) >> 0x10;
            auVar33 = packssdw(auVar47,auVar47);
            rgb64.rgba = CONCAT26(auVar33._6_2_ + auVar52._6_2_,
                                  CONCAT24(auVar33._4_2_ + auVar52._4_2_,
                                           CONCAT22(auVar33._2_2_ + auVar52._2_2_,
                                                    auVar33._0_2_ + auVar52._0_2_)));
          }
          else {
            _Var2._M_head_impl =
                 (colorProfile->m_toLinear)._M_t.
                 super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
                 super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
            if (_Var2._M_head_impl == (unsigned_short *)0x0) {
LAB_0067faec:
              qt_alphamapblit_argb32_oneline();
            }
            auVar33 = psllw(ZEXT716(CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(
                                                  ((uint7)bVar38 << 0x30) >> 0x28),
                                                  CONCAT14(uVar37,uVar24)) >> 0x20),uVar24) >> 0x18)
                                                  ,CONCAT12(uVar36,uVar32)) >> 0x10),
                                             (ushort)(byte)uVar24) & 0xffffff00ffffff),4);
            uVar62 = SUB162(ZEXT116(bVar38) << 0x38,6);
            sVar42 = (_Var2._M_head_impl[auVar33._4_2_] >> 8) + _Var2._M_head_impl[auVar33._4_2_];
            sVar48 = (_Var2._M_head_impl[auVar33._2_2_] >> 8) + _Var2._M_head_impl[auVar33._2_2_];
            auVar40._2_2_ = sVar48;
            auVar40._0_2_ = sVar42;
            sVar49 = (_Var2._M_head_impl[auVar33._0_2_] >> 8) + _Var2._M_head_impl[auVar33._0_2_];
            auVar40._4_2_ = sVar49;
            sVar50 = (uVar62 >> 8) + uVar62;
            auVar40._6_2_ = sVar50;
            uVar24 = bVar1 ^ 0xff;
            uVar30 = srcColor->rgba;
            auVar34._8_8_ = 0;
            auVar34._0_8_ = uVar30;
            auVar40._8_8_ = 0;
            auVar52 = pshuflw(ZEXT216(CONCAT11(bVar1,bVar1)),ZEXT216(CONCAT11(bVar1,bVar1)),0);
            uVar62 = auVar52._6_2_ * (short)(uVar30 >> 0x30);
            auVar60._0_12_ = ZEXT212(uVar62) << 0x30;
            auVar33 = pmulhuw(auVar34,auVar52);
            auVar60._12_2_ = uVar62;
            auVar60._14_2_ = auVar33._6_2_;
            auVar59._12_4_ = auVar60._12_4_;
            auVar59._0_10_ = (unkuint10)uVar62 << 0x30;
            auVar59._10_2_ = auVar33._4_2_;
            Var21 = CONCAT64(auVar59._10_6_,CONCAT22(auVar52._4_2_ * (short)(uVar30 >> 0x20),uVar62)
                            );
            auVar13._4_8_ = (long)((unkuint10)Var21 >> 0x10);
            auVar13._2_2_ = auVar33._2_2_;
            auVar13._0_2_ = auVar52._2_2_ * (short)(uVar30 >> 0x10);
            auVar5._10_2_ = 0;
            auVar5._0_10_ = auVar33._0_10_;
            auVar5._12_2_ = auVar33._6_2_;
            auVar9._8_2_ = auVar33._4_2_;
            auVar9._0_8_ = auVar33._0_8_;
            auVar9._10_4_ = auVar5._10_4_;
            auVar14._6_8_ = 0;
            auVar14._0_6_ = auVar9._8_6_;
            auVar35._0_4_ =
                 (int)((uint)auVar33._0_2_ + CONCAT22(auVar33._0_2_,auVar52._0_2_ * (short)uVar30) +
                      0x8000) >> 0x10;
            auVar35._4_4_ =
                 (int)CONCAT82(SUB148(auVar14 << 0x40,6),auVar33._2_2_) + auVar13._0_4_ + 0x8000 >>
                 0x10;
            auVar35._8_4_ = auVar9._8_4_ + (int)((unkuint10)Var21 >> 0x10) + 0x8000 >> 0x10;
            auVar35._12_4_ = (int)((auVar5._10_4_ >> 0x10) + auVar59._12_4_ + 0x8000) >> 0x10;
            auVar33 = packssdw(auVar35,auVar35);
            auVar52 = ZEXT416(uVar24 << 8 | uVar24);
            auVar53 = pshuflw(auVar52,auVar52,0);
            uVar62 = sVar50 * auVar53._6_2_;
            auVar43._0_10_ = (unkuint10)uVar62 << 0x30;
            auVar44._0_12_ = ZEXT212(uVar62) << 0x30;
            auVar52 = pmulhuw(auVar40,auVar53);
            auVar44._12_2_ = uVar62;
            auVar44._14_2_ = auVar52._6_2_;
            auVar43._12_4_ = auVar44._12_4_;
            auVar43._10_2_ = auVar52._4_2_;
            Var21 = CONCAT64(auVar43._10_6_,CONCAT22(sVar49 * auVar53._4_2_,uVar62));
            auVar15._4_8_ = (long)((unkuint10)Var21 >> 0x10);
            auVar15._2_2_ = auVar52._2_2_;
            auVar15._0_2_ = sVar48 * auVar53._2_2_;
            auVar3._10_2_ = 0;
            auVar3._0_10_ = auVar52._0_10_;
            auVar3._12_2_ = auVar52._6_2_;
            auVar6._8_2_ = auVar52._4_2_;
            auVar6._0_8_ = auVar52._0_8_;
            auVar6._10_4_ = auVar3._10_4_;
            auVar16._6_8_ = 0;
            auVar16._0_6_ = auVar6._8_6_;
            auVar11._4_2_ = auVar52._2_2_;
            auVar11._0_4_ = auVar52._0_4_;
            auVar11._6_8_ = SUB148(auVar16 << 0x40,6);
            auVar41._0_4_ =
                 (int)((auVar52._0_4_ & 0xffff) + CONCAT22(auVar52._0_2_,sVar42 * auVar53._0_2_) +
                      0x8000) >> 0x10;
            auVar41._4_4_ = auVar11._4_4_ + auVar15._0_4_ + 0x8000 >> 0x10;
            auVar41._8_4_ = auVar6._8_4_ + (int)((unkuint10)Var21 >> 0x10) + 0x8000 >> 0x10;
            auVar41._12_4_ = (int)((auVar3._10_4_ >> 0x10) + auVar43._12_4_ + 0x8000) >> 0x10;
            auVar52 = packssdw(auVar41,auVar41);
            rgb64.rgba = CONCAT26(auVar52._6_2_ + auVar33._6_2_,
                                  CONCAT24(auVar52._4_2_ + auVar33._4_2_,
                                           CONCAT22(auVar52._2_2_ + auVar33._2_2_,
                                                    auVar52._0_2_ + auVar33._0_2_)));
          }
          QVar23 = QColorTrcLut::fromLinear64(colorProfile,rgb64);
          goto LAB_0067fac8;
        }
        if (bVar1 == 0xff) {
          if (0xfeffffff < c) goto LAB_0067fac8;
          if (c != 0) {
            uVar30 = ((uVar30 << 0x18 | uVar30) & 0xff00ff00ff00ff) * uVar25;
            uVar30 = uVar30 + 0x80008000800080 + (uVar30 >> 8 & 0xff00ff00ff00ff) >> 8 &
                     0xff00ff00ff00ff;
            uVar24 = (uint)(uVar30 >> 0x18) | (uint)uVar30;
            goto LAB_0067fac6;
          }
        }
        else if (c != 0) {
          uVar26 = bVar1 * uVar27;
          uVar26 = uVar26 + 0x80008000800080 + (uVar26 >> 8 & 0xff00ff00ff00ff);
          uVar29 = uVar26 >> 8 & 0xff00ff00ff00ff;
          uVar30 = ((uVar30 << 0x18 | uVar30) & 0xff00ff00ff00ff) * (~uVar26 >> 0x38);
          uVar30 = uVar30 + 0x80008000800080 + (uVar30 >> 8 & 0xff00ff00ff00ff) >> 8 &
                   0xff00ff00ff00ff;
          QVar23 = ((uint)(uVar30 >> 0x18) | (uint)uVar30) + ((uint)(uVar29 >> 0x18) | (uint)uVar29)
          ;
          goto LAB_0067fac8;
        }
      }
LAB_0067facc:
      uVar31 = uVar31 + 1;
    } while ((uint)mapWidth != uVar31);
  }
  return;
}

Assistant:

static void qt_alphamapblit_argb32_oneline(const uchar *map,
                                           int mapWidth, const QRgba64 &srcColor,
                                           quint32 *dest, const quint32 c,
                                           const QColorTrcLut *colorProfile)
{
    for (int i = 0; i < mapWidth; ++i)
        alphamapblend_argb32(dest + i, map[i], srcColor, c, colorProfile);
}